

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_huffman_codes.cpp
# Opt level: O3

bool lzham::generate_huffman_codes
               (void *pContext,uint num_syms,uint16 *pFreq,uint8 *pCodesizes,uint *max_code_size,
               uint *total_freq_ret)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint *puVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int *piVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  uint *puVar20;
  bool bVar21;
  int x [600];
  uint auStack_d9c [257];
  uint local_998 [344];
  uint auStack_438 [258];
  
  if (599 < num_syms - 1) goto LAB_0010ecf5;
  uVar4 = 0;
  uVar9 = 0;
  uVar19 = 0;
  do {
    uVar1 = pFreq[uVar4];
    if (uVar1 == 0) {
      pCodesizes[uVar4] = '\0';
    }
    else {
      uVar9 = uVar9 + uVar1;
      *(short *)((long)pContext + uVar19 * 8 + 4) = (short)uVar4;
      *(undefined2 *)((long)pContext + uVar19 * 8 + 6) = 0xffff;
      *(uint *)((long)pContext + uVar19 * 8) = (uint)uVar1;
      uVar19 = (ulong)((int)uVar19 + 1);
    }
    uVar4 = uVar4 + 1;
  } while (num_syms != uVar4);
  *total_freq_ret = uVar9;
  uVar18 = (uint)uVar19;
  if (uVar18 == 1) {
    pCodesizes[*(ushort *)((long)pContext + 4)] = '\x01';
    goto LAB_0010ecf5;
  }
  memset(auStack_d9c + 1,0,0x800);
  bVar21 = true;
  bVar3 = true;
  uVar4 = (ulong)(uVar18 & 0xfffffffe);
  if ((uVar19 & 0xfffffffe) != 0) {
    puVar20 = (uint *)((long)pContext + uVar4 * 8);
    puVar12 = (uint *)pContext;
    do {
      uVar7 = *puVar12;
      uVar11 = puVar12[2];
      auStack_d9c[(ulong)(uVar7 & 0xff) + 1] = auStack_d9c[(ulong)(uVar7 & 0xff) + 1] + 1;
      piVar16 = (int *)((long)local_998 + (ulong)(uVar7 >> 6 & 0x3fc));
      *piVar16 = *piVar16 + 1;
      auStack_d9c[(ulong)(uVar11 & 0xff) + 1] = auStack_d9c[(ulong)(uVar11 & 0xff) + 1] + 1;
      piVar16 = (int *)((long)local_998 + (ulong)(uVar11 >> 6 & 0x3fc));
      *piVar16 = *piVar16 + 1;
      puVar12 = puVar12 + 4;
    } while (puVar12 != puVar20);
    bVar3 = true;
    if ((uVar19 & 1) != 0) {
      uVar7 = *puVar20;
      auStack_d9c[(ulong)(uVar7 & 0xff) + 1] = auStack_d9c[(ulong)(uVar7 & 0xff) + 1] + 1;
      piVar16 = (int *)((long)local_998 + (ulong)(uVar7 >> 6 & 0x3fc));
      *piVar16 = *piVar16 + 1;
      bVar3 = false;
    }
  }
  lVar5 = 0;
  puVar20 = (uint *)((long)pContext + 0x2588);
  do {
    puVar12 = puVar20;
    uVar13 = 0xfffffffffffffffe;
    uVar7 = 0;
    do {
      auStack_438[uVar13 + 2] = uVar7;
      iVar10 = auStack_d9c[lVar5 * 0x100 + uVar13 + 3];
      auStack_438[uVar13 + 3] = uVar7 + iVar10;
      uVar7 = uVar7 + iVar10 + auStack_d9c[lVar5 * 0x100 + uVar13 + 4];
      uVar13 = uVar13 + 2;
    } while (uVar13 < 0xfe);
    puVar20 = (uint *)pContext;
    if (uVar4 != 0) {
      puVar20 = (uint *)((long)pContext + uVar4 * 2 * 4);
      lVar6 = 0;
      do {
        uVar7 = *(uint *)((long)pContext + lVar6 + 8);
        uVar11 = uVar7 >> 8;
        uVar8 = *(uint *)((long)pContext + lVar6) >> 8;
        if (bVar21) {
          uVar11 = uVar7;
          uVar8 = *(uint *)((long)pContext + lVar6);
        }
        uVar8 = uVar8 & 0xff;
        uVar11 = uVar11 & 0xff;
        uVar7 = auStack_438[uVar8];
        if (uVar8 == uVar11) {
          auStack_438[uVar8] = uVar7 + 2;
          *(undefined8 *)(puVar12 + (ulong)uVar7 * 2) = *(undefined8 *)((long)pContext + lVar6);
          uVar8 = uVar7 + 1;
        }
        else {
          auStack_438[uVar8] = uVar7 + 1;
          uVar8 = auStack_438[uVar11];
          auStack_438[uVar11] = uVar8 + 1;
          *(undefined8 *)(puVar12 + (ulong)uVar7 * 2) = *(undefined8 *)((long)pContext + lVar6);
        }
        *(undefined8 *)(puVar12 + (ulong)uVar8 * 2) = *(undefined8 *)((long)pContext + lVar6 + 8);
        lVar6 = lVar6 + 0x10;
      } while ((ulong)(uVar18 & 0xfffffffe) << 3 != lVar6);
    }
    if (!bVar3) {
      uVar11 = *puVar20 >> (sbyte)((int)lVar5 << 3) & 0xff;
      uVar7 = auStack_438[uVar11];
      auStack_438[uVar11] = uVar7 + 1;
      *(undefined8 *)(puVar12 + (ulong)uVar7 * 2) = *(undefined8 *)puVar20;
    }
    lVar5 = 1;
    uVar7 = 0;
    bVar2 = (bool)(local_998[0] != uVar18 & bVar21);
    bVar21 = false;
    puVar20 = (uint *)pContext;
    pContext = puVar12;
  } while (bVar2);
  if (uVar18 != 0) {
    uVar4 = 0;
    do {
      auStack_d9c[uVar4 + 1] = puVar12[uVar4 * 2];
      uVar4 = uVar4 + 1;
    } while (uVar19 != uVar4);
    if (uVar18 != 0) {
      auStack_d9c[1] = auStack_d9c[1] + auStack_d9c[2];
      uVar7 = uVar18 - 1;
      if ((int)uVar18 < 3) {
        auStack_d9c[(long)(int)uVar18 + 0xffffffffffffffff] = 0;
      }
      else {
        iVar14 = 0;
        iVar10 = 2;
        uVar4 = 1;
        do {
          lVar5 = (long)iVar14;
          if ((iVar10 < (int)uVar18) &&
             (lVar6 = (long)iVar10, (int)auStack_d9c[lVar6 + 1] <= (int)auStack_d9c[lVar5 + 1])) {
            iVar10 = iVar10 + 1;
            auStack_d9c[uVar4 + 1] = auStack_d9c[lVar6 + 1];
          }
          else {
            auStack_d9c[uVar4 + 1] = auStack_d9c[lVar5 + 1];
            iVar14 = iVar14 + 1;
            auStack_d9c[lVar5 + 1] = (int)uVar4;
            lVar5 = (long)iVar14;
          }
          if (iVar10 < (int)uVar18) {
            if (lVar5 < (long)uVar4) {
              iVar15 = auStack_d9c[lVar5 + 1];
              iVar17 = auStack_d9c[(long)iVar10 + 1];
              if (iVar15 < iVar17) goto LAB_0010ebff;
            }
            else {
              iVar17 = auStack_d9c[(long)iVar10 + 1];
            }
            iVar10 = iVar10 + 1;
            auStack_d9c[uVar4 + 1] = auStack_d9c[uVar4 + 1] + iVar17;
          }
          else {
            iVar15 = auStack_d9c[lVar5 + 1];
LAB_0010ebff:
            auStack_d9c[uVar4 + 1] = auStack_d9c[uVar4 + 1] + iVar15;
            iVar14 = iVar14 + 1;
            auStack_d9c[lVar5 + 1] = (int)uVar4;
          }
          uVar4 = uVar4 + 1;
        } while (uVar7 != uVar4);
        auStack_d9c[(long)(int)uVar18 + 0xffffffffffffffff] = 0;
        uVar4 = (ulong)(uVar18 - 3);
        do {
          auStack_d9c[uVar4 + 1] = auStack_d9c[(long)(int)auStack_d9c[uVar4 + 1] + 1] + 1;
          bVar21 = uVar4 != 0;
          uVar4 = uVar4 - 1;
        } while (bVar21);
      }
      uVar11 = uVar18 - 2;
      iVar10 = 1;
      iVar14 = 0;
      do {
        if ((int)uVar11 < 0) {
          iVar15 = 0;
        }
        else {
          iVar17 = uVar11 + 1;
          iVar15 = 0;
          do {
            if (auStack_d9c[(ulong)uVar11 + 1] != iVar14) goto LAB_0010ec97;
            iVar15 = iVar15 + 1;
            uVar11 = uVar11 - 1;
          } while (iVar17 != iVar15);
          uVar11 = 0xffffffff;
          iVar15 = iVar17;
        }
LAB_0010ec97:
        if (iVar15 < iVar10) {
          piVar16 = (int *)(auStack_d9c + (long)(int)uVar7 + 1);
          uVar7 = (uVar7 + iVar15) - iVar10;
          do {
            *piVar16 = iVar14;
            iVar10 = iVar10 + -1;
            piVar16 = piVar16 + -1;
          } while (iVar15 < iVar10);
        }
        iVar10 = iVar15 * 2;
        iVar14 = iVar14 + 1;
      } while (iVar15 != 0);
      if (uVar18 != 0) {
        uVar4 = 0;
        uVar7 = 0;
        do {
          uVar18 = auStack_d9c[uVar4 + 1];
          if (uVar7 < uVar18) {
            uVar7 = uVar18;
          }
          pCodesizes[(ushort)puVar12[uVar4 * 2 + 1]] = (uint8)uVar18;
          uVar4 = uVar4 + 1;
        } while (uVar19 != uVar4);
        goto LAB_0010ecee;
      }
    }
    uVar7 = 0;
  }
LAB_0010ecee:
  *max_code_size = uVar7;
LAB_0010ecf5:
  return num_syms - 1 < 600;
}

Assistant:

bool generate_huffman_codes(void* pContext, uint num_syms, const uint16* pFreq, uint8* pCodesizes, uint& max_code_size, uint& total_freq_ret)
   {
      if ((!num_syms) || (num_syms > cHuffmanMaxSupportedSyms))
         return false;
                  
      huffman_work_tables& state = *static_cast<huffman_work_tables*>(pContext);;
            
      uint max_freq = 0;
      uint total_freq = 0;
      
      uint num_used_syms = 0;
      for (uint i = 0; i < num_syms; i++)
      {
         uint freq = pFreq[i];
         
         if (!freq)
            pCodesizes[i] = 0;
         else
         {
            total_freq += freq;
            max_freq = math::maximum(max_freq, freq);
            
            sym_freq& sf = state.syms0[num_used_syms];
            sf.m_left = (uint16)i;
            sf.m_right = UINT16_MAX;
            sf.m_freq = freq;
            num_used_syms++;
         }            
      }
      
      total_freq_ret = total_freq;

      if (num_used_syms == 1)
      {
         pCodesizes[state.syms0[0].m_left] = 1;
         return true;
      }

      sym_freq* syms = radix_sort_syms(num_used_syms, state.syms0, state.syms1);
      
#if USE_CALCULATE_MINIMUM_REDUNDANCY
      int x[cHuffmanMaxSupportedSyms];
      for (uint i = 0; i < num_used_syms; i++)
         x[i] = syms[i].m_freq;
      
      calculate_minimum_redundancy(x, num_used_syms);
      
      uint max_len = 0;
      for (uint i = 0; i < num_used_syms; i++)
      {
         uint len = x[i];
         max_len = math::maximum(len, max_len);
         pCodesizes[syms[i].m_left] = static_cast<uint8>(len);
      }
      max_code_size = max_len;
#else    
      // Computes Huffman codelengths in linear time. More readable than calculate_minimum_redundancy(), and approximately the same speed, but not in-place.
      
      // Dummy node
      sym_freq& sf = state.syms0[num_used_syms];
      sf.m_left = UINT16_MAX;
      sf.m_right = UINT16_MAX;
      sf.m_freq = UINT_MAX;
      
      uint next_internal_node = num_used_syms + 1;
            
      uint queue_front = 0;
      uint queue_end = 0;
            
      uint next_lowest_sym = 0;
      
      uint num_nodes_remaining = num_used_syms;
      do
      {
         uint left_freq = syms[next_lowest_sym].m_freq;
         uint left_child = next_lowest_sym;
         
         if ((queue_end > queue_front) && (syms[state.queue[queue_front]].m_freq < left_freq))
         {
            left_child = state.queue[queue_front];
            left_freq = syms[left_child].m_freq;
            
            queue_front++;
         }
         else
            next_lowest_sym++;
         
         uint right_freq = syms[next_lowest_sym].m_freq;
         uint right_child = next_lowest_sym;

         if ((queue_end > queue_front) && (syms[state.queue[queue_front]].m_freq < right_freq))
         {
            right_child = state.queue[queue_front];
            right_freq = syms[right_child].m_freq;
            
            queue_front++;
         }
         else
            next_lowest_sym++;
      
         LZHAM_ASSERT(next_internal_node < huffman_work_tables::cMaxInternalNodes);
         
         const uint internal_node_index = next_internal_node;
         next_internal_node++;
         
         syms[internal_node_index].m_freq = left_freq + right_freq;
         syms[internal_node_index].m_left = static_cast<uint16>(left_child);
         syms[internal_node_index].m_right = static_cast<uint16>(right_child);
         
         LZHAM_ASSERT(queue_end < huffman_work_tables::cMaxInternalNodes);
         state.queue[queue_end] = static_cast<uint16>(internal_node_index);
         queue_end++;
                  
         num_nodes_remaining--;
         
      } while (num_nodes_remaining > 1);
      
      LZHAM_ASSERT(next_lowest_sym == num_used_syms);
      LZHAM_ASSERT((queue_end - queue_front) == 1);
      
      uint cur_node_index = state.queue[queue_front];
      
      uint32* pStack = (syms == state.syms0) ? (uint32*)state.syms1 : (uint32*)state.syms0;
      uint32* pStack_top = pStack;

      uint max_level = 0;
      
      for ( ; ; ) 
      {
         uint level = cur_node_index >> 16;
         uint node_index = cur_node_index & 0xFFFF;
         
         uint left_child = syms[node_index].m_left;
         uint right_child = syms[node_index].m_right;
         
         uint next_level = (cur_node_index + 0x10000) & 0xFFFF0000;
                           
         if (left_child < num_used_syms)
         {
            max_level = math::maximum(max_level, level);
            
            pCodesizes[syms[left_child].m_left] = static_cast<uint8>(level + 1);
            
            if (right_child < num_used_syms)
            {
               pCodesizes[syms[right_child].m_left] = static_cast<uint8>(level + 1);
               
               if (pStack == pStack_top) break;
               cur_node_index = *--pStack;
            }
            else
            {
               cur_node_index = next_level | right_child;
            }
         }
         else
         {
            if (right_child < num_used_syms)
            {
               max_level = math::maximum(max_level, level);
               
               pCodesizes[syms[right_child].m_left] = static_cast<uint8>(level + 1);
                              
               cur_node_index = next_level | left_child;
            }
            else
            {
               *pStack++ = next_level | left_child;
                              
               cur_node_index = next_level | right_child;
            }
         }
      }
      
      max_code_size = max_level + 1;
#endif
                  
      return true;
   }